

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

Regexp * __thiscall re2::Regexp::Incref(Regexp *this)

{
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  mapped_type *pmVar4;
  undefined8 uVar5;
  undefined8 *in_FS_OFFSET;
  undefined1 local_21;
  Regexp *local_20;
  
  if (this->ref_ < 0xfffe) {
    this->ref_ = this->ref_ + 1;
    return this;
  }
  local_20 = (Regexp *)&local_21;
  plVar1 = (long *)*in_FS_OFFSET;
  *plVar1 = (long)&local_20;
  puVar2 = (undefined8 *)*in_FS_OFFSET;
  *puVar2 = std::once_flag::_Prepare_execution::
            _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
            ::anon_class_1_0_00000001::__invoke;
  iVar3 = pthread_once(&Incref::ref_once._M_once,__once_proxy);
  if (iVar3 == 0) {
    *plVar1 = 0;
    *puVar2 = 0;
    iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)ref_storage);
    if (iVar3 == 0) {
      local_20 = this;
      if (this->ref_ == 0xffff) {
        pmVar4 = std::
                 map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
                 ::operator[]((map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
                               *)(ref_storage + 0x38),&local_20);
        *pmVar4 = *pmVar4 + 1;
      }
      else {
        pmVar4 = std::
                 map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
                 ::operator[]((map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
                               *)(ref_storage + 0x38),&local_20);
        *pmVar4 = 0xffff;
        this->ref_ = 0xffff;
      }
      iVar3 = pthread_rwlock_unlock((pthread_rwlock_t *)ref_storage);
      if (iVar3 == 0) {
        return this;
      }
    }
  }
  else {
    uVar5 = std::__throw_system_error(iVar3);
    iVar3 = pthread_rwlock_unlock((pthread_rwlock_t *)ref_storage);
    if (iVar3 == 0) {
      _Unwind_Resume(uVar5);
    }
  }
  abort();
}

Assistant:

Regexp* Regexp::Incref() {
  if (ref_ >= kMaxRef-1) {
    static std::once_flag ref_once;
    std::call_once(ref_once, []() {
      (void) new (ref_storage) RefStorage;
    });

    // Store ref count in overflow map.
    MutexLock l(ref_mutex());
    if (ref_ == kMaxRef) {
      // already overflowed
      (*ref_map())[this]++;
    } else {
      // overflowing now
      (*ref_map())[this] = kMaxRef;
      ref_ = kMaxRef;
    }
    return this;
  }

  ref_++;
  return this;
}